

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V2_Annotation::IsValid(ON_OBSOLETE_V2_Annotation *this,ON_TextLog *text_log)

{
  bool local_19;
  bool rc;
  ON_TextLog *text_log_local;
  ON_OBSOLETE_V2_Annotation *this_local;
  
  local_19 = true;
  if (this->m_type == dtNothing) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "ON_OBSOLETE_V2_Annotation has m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing.\n"
                       );
    }
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ON_OBSOLETE_V2_Annotation::IsValid( ON_TextLog* text_log ) const
{
  // TODO: quickly inspect object and return true/false
  bool rc = true;
  if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing == m_type  )
  {
    if ( 0 != text_log )
      text_log->Print("ON_OBSOLETE_V2_Annotation has m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing.\n");
    rc = false;
  }
  return rc;
}